

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

bool anon_unknown.dwarf_1ae54::SolverDpllTriadSimd<0>::InitVanillaByBand(char *input,State *state)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 in_RCX;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  
  auVar11[8] = 0x2e;
  auVar11._0_8_ = 0x2e2e2e2e2e2e2e2e;
  auVar11[9] = 0x2e;
  auVar11[10] = 0x2e;
  auVar11[0xb] = 0x2e;
  auVar11[0xc] = 0x2e;
  auVar11[0xd] = 0x2e;
  auVar11[0xe] = 0x2e;
  auVar11[0xf] = 0x2e;
  auVar11[0x10] = 0x2e;
  auVar11[0x11] = 0x2e;
  auVar11[0x12] = 0x2e;
  auVar11[0x13] = 0x2e;
  auVar11[0x14] = 0x2e;
  auVar11[0x15] = 0x2e;
  auVar11[0x16] = 0x2e;
  auVar11[0x17] = 0x2e;
  auVar11[0x18] = 0x2e;
  auVar11[0x19] = 0x2e;
  auVar11[0x1a] = 0x2e;
  auVar11[0x1b] = 0x2e;
  auVar11[0x1c] = 0x2e;
  auVar11[0x1d] = 0x2e;
  auVar11[0x1e] = 0x2e;
  auVar11[0x1f] = 0x2e;
  uVar1 = vpcmpeqb_avx512vl(auVar11,*(undefined1 (*) [32])input);
  lVar2 = vpcmpeqb_avx512vl(auVar11,*(undefined1 (*) [32])(input + 0x20));
  uVar8 = lVar2 << 0x20 | CONCAT44((int)((ulong)in_RCX >> 0x20),(int)uVar1);
  if (uVar8 != 0xffffffffffffffff) {
    uVar8 = ~uVar8;
    do {
      lVar2 = 0;
      for (uVar5 = uVar8; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
        lVar2 = lVar2 + 1;
      }
      auVar11 = vandnps_avx(*(undefined1 (*) [32])
                             ((anonymous_namespace)::tables +
                             (ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1905] * 0x20 +
                             ((long)input[lVar2] + -0x31) * 0x200),
                            *(undefined1 (*) [32])
                             state->boxen[(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1902]].
                             cells.vec);
      *(undefined1 (*) [32])
       state->boxen[(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1902]].cells.vec = auVar11;
      auVar9 = vpbroadcastw_avx512vl();
      auVar10 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                     ((ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1903]
                                      * 0x10 + (ulong)(byte)(anonymous_namespace)::tables
                                                            [lVar2 * 6 + 0x1901] * 0x40 + 0x111440),
                                    auVar9,*(undefined1 (*) [16])
                                            state->bands[0]
                                            [(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1900]
                                            ].eliminations.vec,0xea);
      *(undefined1 (*) [16])
       state->bands[0][(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1900]].eliminations.vec =
           auVar10;
      auVar9 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                    ((ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1904]
                                     * 0x10 + (ulong)(byte)(anonymous_namespace)::tables
                                                           [lVar2 * 6 + 0x1900] * 0x40 + 0x111440),
                                   auVar9,*(undefined1 (*) [16])
                                           (state->boxen
                                            [(ulong)(byte)(anonymous_namespace)::tables
                                                          [lVar2 * 6 + 0x1901] - 3].cells.vec + 2),
                                   0xea);
      *(undefined1 (*) [16])
       (state->boxen[(ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1901] - 3].cells.vec +
       2) = auVar9;
      uVar8 = uVar8 - 1 & uVar8;
    } while (uVar8 != 0);
  }
  auVar9[8] = 0x2e;
  auVar9._0_8_ = 0x2e2e2e2e2e2e2e2e;
  auVar9[9] = 0x2e;
  auVar9[10] = 0x2e;
  auVar9[0xb] = 0x2e;
  auVar9[0xc] = 0x2e;
  auVar9[0xd] = 0x2e;
  auVar9[0xe] = 0x2e;
  auVar9[0xf] = 0x2e;
  uVar1 = vpcmpeqb_avx512vl(auVar9,*(undefined1 (*) [16])(input + 0x40));
  if ((short)uVar1 != -1) {
    uVar7 = ~(uint)uVar1 & 0xffff;
    do {
      uVar3 = 0;
      for (uVar4 = uVar7; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
        uVar3 = uVar3 + 1;
      }
      lVar2 = (ulong)uVar3 + 0x40;
      auVar11 = vandnps_avx(*(undefined1 (*) [32])
                             ((anonymous_namespace)::tables +
                             (ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1905] * 0x20 +
                             ((long)input[(ulong)uVar3 + 0x40] + -0x31) * 0x200),
                            *(undefined1 (*) [32])
                             state->boxen[(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1902]].
                             cells.vec);
      *(undefined1 (*) [32])
       state->boxen[(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1902]].cells.vec = auVar11;
      auVar9 = vpbroadcastw_avx512vl();
      auVar10 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                     ((ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1903]
                                      * 0x10 + (ulong)(byte)(anonymous_namespace)::tables
                                                            [lVar2 * 6 + 0x1901] * 0x40 + 0x111440),
                                    auVar9,*(undefined1 (*) [16])
                                            state->bands[0]
                                            [(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1900]
                                            ].eliminations.vec,0xea);
      *(undefined1 (*) [16])
       state->bands[0][(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1900]].eliminations.vec =
           auVar10;
      auVar9 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                    ((ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1904]
                                     * 0x10 + (ulong)(byte)(anonymous_namespace)::tables
                                                           [lVar2 * 6 + 0x1900] * 0x40 + 0x111440),
                                   auVar9,*(undefined1 (*) [16])
                                           (state->boxen
                                            [(ulong)(byte)(anonymous_namespace)::tables
                                                          [lVar2 * 6 + 0x1901] - 3].cells.vec + 2),
                                   0xea);
      *(undefined1 (*) [16])
       (state->boxen[(ulong)(byte)(anonymous_namespace)::tables[lVar2 * 6 + 0x1901] - 3].cells.vec +
       2) = auVar9;
      uVar7 = uVar7 - 1 & uVar7;
    } while (uVar7 != 0);
  }
  if ((long)input[0x50] != 0x2e) {
    auVar11 = vandnps_avx(*(undefined1 (*) [32])
                           ((anonymous_namespace)::tables +
                           (ulong)(anonymous_namespace)::tables[0x1ae5] * 0x20 +
                           ((long)input[0x50] + -0x31) * 0x200),
                          *(undefined1 (*) [32])
                           state->boxen[(anonymous_namespace)::tables[0x1ae2]].cells.vec);
    *(undefined1 (*) [32])state->boxen[(anonymous_namespace)::tables[0x1ae2]].cells.vec = auVar11;
    auVar9 = vpbroadcastw_avx512vl();
    auVar10 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                   ((ulong)(anonymous_namespace)::tables[0x1ae3] * 0x10 +
                                   (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x40 + 0x111440),
                                  auVar9,*(undefined1 (*) [16])
                                          state->bands[0][(anonymous_namespace)::tables[0x1ae0]].
                                          eliminations.vec,0xea);
    *(undefined1 (*) [16])state->bands[0][(anonymous_namespace)::tables[0x1ae0]].eliminations.vec =
         auVar10;
    auVar9 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                  ((ulong)(anonymous_namespace)::tables[0x1ae4] * 0x10 +
                                  (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x40 + 0x111440),
                                 auVar9,*(undefined1 (*) [16])
                                         (state->boxen
                                          [(ulong)(anonymous_namespace)::tables[0x1ae1] - 3].cells.
                                          vec + 2),0xea);
    *(undefined1 (*) [16])
     (state->boxen[(ulong)(anonymous_namespace)::tables[0x1ae1] - 3].cells.vec + 2) = auVar9;
  }
  bVar6 = BandEliminate<0>(state,0,1);
  if (bVar6) {
    bVar6 = BandEliminate<1>(state,0,1);
    if (bVar6) {
      bVar6 = BandEliminate<0>(state,1,2);
      if (bVar6) {
        bVar6 = BandEliminate<1>(state,1,2);
        if (bVar6) {
          bVar6 = BandEliminate<0>(state,2,0);
          if (bVar6) {
            bVar6 = BandEliminate<1>(state,2,0);
            return bVar6;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool InitVanillaByBand(const char *input, State &state) {
        uint64_t clues64 = WhichDots64(input) ^ (uint64_t)-1ll;
        while (clues64) {
            int cell_idx = LowOrderBitIndex64(clues64);
            InitClue(input, state, cell_idx);
            clues64 = ClearLowBit64(clues64);
        }
        uint32_t clues16 = WhichDots16(input + 64) ^ 0xffffu;
        while (clues16) {
            int cell_idx = 64 + LowOrderBitIndex(clues16);
            InitClue(input, state, cell_idx);
            clues16 = ClearLowBit(clues16);
        }
        if (input[80] != '.') {
            InitClue(input, state, 80);
        }
        // thanks to the merging of band updates the puzzle is almost always fully initialized
        // after the first of these calls. most will be no-ops, but we've still got to do them
        // since this cannot be guaranteed.
        return BandEliminate<0>(state, 0, 1) && BandEliminate<1>(state, 0, 1) &&
               BandEliminate<0>(state, 1, 2) && BandEliminate<1>(state, 1, 2) &&
               BandEliminate<0>(state, 2, 0) && BandEliminate<1>(state, 2, 0);
    }